

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatMap.c
# Opt level: O3

int Sbm_ManCheckSol(Sbm_Man_t *p,Vec_Int_t *vSol)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  Vec_Int_t *pVVar5;
  Vec_Int_t *pVVar6;
  int iVar7;
  ulong uVar8;
  char *__format;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  p->vPolar->nSize = 0;
  pVVar5 = p->vLit2Used;
  uVar8 = (long)p->nInputs + (long)p->vObjCuts->nSize;
  iVar7 = (int)uVar8;
  if (pVVar5->nCap < iVar7) {
    if (pVVar5->pArray == (int *)0x0) {
      piVar4 = (int *)malloc(uVar8 * 4);
    }
    else {
      piVar4 = (int *)realloc(pVVar5->pArray,uVar8 * 4);
    }
    pVVar5->pArray = piVar4;
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar5->nCap = iVar7;
  }
  if (0 < iVar7) {
    memset(pVVar5->pArray,0,(uVar8 & 0xffffffff) << 2);
  }
  pVVar5->nSize = iVar7;
  pVVar5 = p->vSolCuts;
  if (0 < pVVar5->nSize) {
    lVar11 = 0;
    do {
      iVar7 = pVVar5->pArray[lVar11];
      lVar10 = (long)iVar7;
      if (lVar10 < 0) {
        uVar9 = -iVar7;
        uVar2 = p->vLit2Used->nSize;
        if (uVar2 == uVar9 || SBORROW4(uVar2,uVar9) != (int)(uVar2 + iVar7) < 0) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        piVar4 = p->vLit2Used->pArray + uVar9;
LAB_007b2398:
        *piVar4 = 1;
        Vec_IntPush(p->vPolar,uVar9);
      }
      else {
        Vec_IntPush(p->vPolar,p->FirstVar + iVar7);
        if (p->vCuts->nSize <= iVar7) goto LAB_007b2593;
        pVVar5 = p->vCuts->pArray;
        if (((pVVar5[lVar10].nSize < 1) ||
            (uVar9 = *pVVar5[lVar10].pArray - p->LitShift, (int)uVar9 < 0)) ||
           (p->vLit2Used->nSize <= (int)uVar9)) goto LAB_007b2536;
        piVar4 = p->vLit2Used->pArray;
        if (piVar4[uVar9] == 0) {
          piVar4 = piVar4 + uVar9;
          goto LAB_007b2398;
        }
      }
      lVar11 = lVar11 + 1;
      pVVar5 = p->vSolCuts;
    } while (lVar11 < pVVar5->nSize);
  }
  pVVar6 = p->vRoots;
  if (pVVar6->nSize < 1) {
    iVar7 = 1;
  }
  else {
    iVar7 = 1;
    lVar11 = 0;
    do {
      iVar1 = pVVar6->pArray[lVar11];
      if (((long)iVar1 < 0) || (p->vLit2Used->nSize <= iVar1)) {
LAB_007b2536:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (p->vLit2Used->pArray[iVar1] == 0) {
        iVar7 = 0;
        printf("Output literal %d has no cut.\n");
        pVVar6 = p->vRoots;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < pVVar6->nSize);
    pVVar5 = p->vSolCuts;
  }
  if (0 < pVVar5->nSize) {
    lVar11 = 0;
    do {
      uVar2 = pVVar5->pArray[lVar11];
      lVar10 = (long)(int)uVar2;
      if (-1 < lVar10) {
        if (p->vCuts->nSize <= (int)uVar2) {
LAB_007b2593:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        pVVar5 = p->vCuts->pArray;
        if (1 < pVVar5[lVar10].nSize) {
          lVar12 = 1;
          do {
            uVar9 = pVVar5[lVar10].pArray[lVar12];
            uVar3 = uVar9 - p->LitShift;
            if ((int)uVar3 < 0) {
              if ((int)uVar9 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x130,"int Abc_LitIsCompl(int)");
              }
              if ((uVar9 & 1) == 0) {
                __assert_fail("Abc_LitIsCompl(Lit)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatMap.c"
                              ,0x7e,"int Sbm_ManCheckSol(Sbm_Man_t *, Vec_Int_t *)");
              }
              uVar9 = uVar9 >> 1;
              iVar1 = p->vObjCuts->nSize;
              uVar3 = iVar1 + uVar9;
              if ((uVar3 == 0 || SCARRY4(iVar1,uVar9) != (int)uVar3 < 0) ||
                 (p->vLit2Used->nSize < (int)uVar3)) goto LAB_007b2536;
              if (p->vLit2Used->pArray[(ulong)uVar3 - 1] == 0) {
                uVar3 = uVar9 - 1;
                __format = "Inverter of input %d of cut %d is not mapped.\n";
                goto LAB_007b24e7;
              }
            }
            else {
              if (p->vLit2Used->nSize <= (int)uVar3) goto LAB_007b2536;
              if (p->vLit2Used->pArray[uVar3] == 0) {
                __format = "Internal literal %d of cut %d is not mapped.\n";
LAB_007b24e7:
                iVar7 = 0;
                printf(__format,(ulong)uVar3,(ulong)uVar2);
              }
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 < pVVar5[lVar10].nSize);
        }
        Vec_IntPush(p->vPolar,uVar2 + p->FirstVar);
        pVVar5 = p->vSolCuts;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < pVVar5->nSize);
  }
  return iVar7;
}

Assistant:

int Sbm_ManCheckSol( Sbm_Man_t * p, Vec_Int_t * vSol )
{
    //int K = Vec_IntSize(vSol) - 1;
    int i, j, Lit, Cut;
    int RetValue = 1;
    Vec_Int_t * vCut;
    // clear polarity and assumptions
    Vec_IntClear( p->vPolar );
    // mark used literals
    Vec_IntFill( p->vLit2Used, Vec_WecSize(p->vObjCuts) + p->nInputs, 0 );
    Vec_IntForEachEntry( p->vSolCuts, Cut, i )
    {
        if ( Cut < 0 ) // input inverter variable
        {
            Vec_IntWriteEntry( p->vLit2Used, -Cut, 1 );
            Vec_IntPush( p->vPolar, -Cut ); 
            continue;
        }
        Vec_IntPush( p->vPolar, p->FirstVar + Cut ); 
        vCut = Vec_WecEntry( p->vCuts, Cut );
        Lit = Vec_IntEntry( vCut, 0 ) - p->LitShift; // obj literal
        if ( Vec_IntEntry(p->vLit2Used, Lit) )
            continue;
        Vec_IntWriteEntry( p->vLit2Used, Lit, 1 );
        Vec_IntPush( p->vPolar, Lit ); // literal variable
    }
    // check that the output literals are used
    Vec_IntForEachEntry( p->vRoots, Lit, i )
    {
        if ( Vec_IntEntry(p->vLit2Used, Lit) == 0 )
            printf( "Output literal %d has no cut.\n", Lit ), RetValue = 0;
    }
    // check internal nodes
    Vec_IntForEachEntry( p->vSolCuts, Cut, i )
    {
        if ( Cut < 0 )
            continue;
        vCut = Vec_WecEntry( p->vCuts, Cut );
        Vec_IntForEachEntryStart( vCut, Lit, j, 1 )
            if ( Lit - p->LitShift < 0 )
            {
                assert( Abc_LitIsCompl(Lit) );
                if ( Vec_IntEntry(p->vLit2Used, Vec_WecSize(p->vObjCuts) + Abc_Lit2Var(Lit)-1) == 0 )
                    printf( "Inverter of input %d of cut %d is not mapped.\n", Abc_Lit2Var(Lit)-1, Cut ), RetValue = 0;
            }
            else if ( Vec_IntEntry(p->vLit2Used, Lit - p->LitShift) == 0 )
                printf( "Internal literal %d of cut %d is not mapped.\n", Lit - p->LitShift, Cut ), RetValue = 0;
        // create polarity
        Vec_IntPush( p->vPolar, p->FirstVar + Cut ); // cut variable
    }
    return RetValue;
}